

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

CAddr __thiscall
cppforth::Forth::virtualMemorySegmentInit(Forth *this,vmSegments segmentNum,Cell size)

{
  pointer pVVar1;
  pointer pVVar2;
  ulong uVar3;
  ulong uVar4;
  CAddr CVar5;
  VirtualMemorySegment variables;
  allocator_type local_39;
  undefined1 local_38 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  pVVar1 = (this->VirtualMemory).
           super__Vector_base<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pVVar2 = (this->VirtualMemory).
           super__Vector_base<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar3 = (long)pVVar2 - (long)pVVar1 >> 5;
  if (uVar3 == segmentNum) {
    if (pVVar2 == pVVar1) {
      CVar5 = 0;
    }
    else {
      uVar4 = (ulong)(int)(segmentNum - vmSegmentSourceBufferRefill);
      if (uVar3 <= uVar4) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar4
                   ,uVar3);
      }
      CVar5 = pVVar1[uVar4].end + 1;
    }
    local_38._4_4_ = CVar5 + size;
    local_38._0_4_ = CVar5;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_38 + 8),(ulong)size,
               &local_39);
    std::
    vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
    ::push_back(&this->VirtualMemory,(value_type *)local_38);
    this->VirtualMemoryFreeSegment = CVar5 + size;
    if ((pointer)local_38._8_8_ != (pointer)0x0) {
      operator_delete((void *)local_38._8_8_,local_28._8_8_ - local_38._8_8_);
    }
  }
  else {
    local_38._0_8_ = &local_28;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_38,"VirtualMemory init failure","");
    throwCppExceptionMessage(this,(string *)local_38,errorAllocate);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._0_8_ != &local_28) {
      operator_delete((void *)local_38._0_8_,local_28._M_allocated_capacity + 1);
    }
    CVar5 = 0;
  }
  return CVar5;
}

Assistant:

CAddr virtualMemorySegmentInit(vmSegments segmentNum, Cell size ){
			if (VirtualMemory.size() == segmentNum) {
				Cell start{},end{};
				start=(VirtualMemory.size()==0)?0:VirtualMemory.at(segmentNum-1).end+1;
				end=start+size;
				VirtualMemorySegment variables{ start, end, std::vector<Char>(end-start) };
				VirtualMemory.push_back(variables);
				VirtualMemoryFreeSegment = end;
				return start;
			} else {
				throwCppExceptionMessage("VirtualMemory init failure",errorAllocate);
			}
			assert("!Not reachable");
			return 0; // to avoid warning. this code in not reachable	
		}